

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O2

bool __thiscall TinyProcessLib::Process::try_get_exit_status(Process *this,int *exit_status)

{
  bool bVar1;
  __pid_t _Var2;
  uint uVar3;
  int *piVar4;
  
  _Var2 = (this->data).id;
  if (_Var2 < 1) {
LAB_001586ab:
    bVar1 = false;
  }
  else {
    _Var2 = waitpid(_Var2,exit_status,1);
    if (_Var2 < 0) {
      piVar4 = __errno_location();
      if (*piVar4 != 10) goto LAB_001586ab;
      *exit_status = (this->data).exit_status;
    }
    else {
      if (_Var2 == 0) goto LAB_001586ab;
      uVar3 = *exit_status;
      if (0xff < (int)uVar3) {
        uVar3 = uVar3 >> 8;
        *exit_status = uVar3;
      }
      (this->data).exit_status = uVar3;
      std::mutex::lock(&this->close_mutex);
      this->closed = true;
      pthread_mutex_unlock((pthread_mutex_t *)&this->close_mutex);
      close_fds(this);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Process::try_get_exit_status(int &exit_status) noexcept {
  if(data.id <= 0)
    return false;

  const id_type p = waitpid(data.id, &exit_status, WNOHANG);
  if(p < 0 && errno == ECHILD) {
    // PID doesn't exist anymore, set previously sampled exit status (or -1)
    exit_status = data.exit_status;
    return true;
  }
  else if(p <= 0) {
    // Process still running (p==0) or error
    return false;
  }
  else {
    // store exit status for future calls
    if(exit_status >= 256)
      exit_status = exit_status >> 8;
    data.exit_status = exit_status;
  }

  {
    std::lock_guard<std::mutex> lock(close_mutex);
    closed = true;
  }
  close_fds();

  return true;
}